

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

ProjectBuilderSubDirs ** __thiscall
QtPrivate::QPodArrayOps<ProjectBuilderSubDirs_*>::createHole
          (QPodArrayOps<ProjectBuilderSubDirs_*> *this,GrowthPosition pos,qsizetype where,
          qsizetype n)

{
  qsizetype *pqVar1;
  ProjectBuilderSubDirs **ppPVar2;
  long lVar3;
  long lVar4;
  ProjectBuilderSubDirs **__src;
  
  ppPVar2 = (this->super_QArrayDataPointer<ProjectBuilderSubDirs_*>).ptr;
  __src = ppPVar2 + where;
  if (pos == GrowsAtEnd) {
    lVar3 = (this->super_QArrayDataPointer<ProjectBuilderSubDirs_*>).size;
    lVar4 = lVar3 - where;
    if (lVar4 != 0 && where <= lVar3) {
      memmove(__src + n,__src,lVar4 * 8);
    }
  }
  else {
    (this->super_QArrayDataPointer<ProjectBuilderSubDirs_*>).ptr = ppPVar2 + -n;
    __src = __src + -n;
  }
  pqVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSubDirs_*>).size;
  *pqVar1 = *pqVar1 + n;
  return __src;
}

Assistant:

T *createHole(QArrayData::GrowthPosition pos, qsizetype where, qsizetype n)
    {
        Q_ASSERT((pos == QArrayData::GrowsAtBeginning && n <= this->freeSpaceAtBegin()) ||
                 (pos == QArrayData::GrowsAtEnd && n <= this->freeSpaceAtEnd()));

        T *insertionPoint = this->ptr + where;
        if (pos == QArrayData::GrowsAtEnd) {
            if (where < this->size)
                ::memmove(static_cast<void *>(insertionPoint + n), static_cast<void *>(insertionPoint), (this->size - where) * sizeof(T));
        } else {
            Q_ASSERT(where == 0);
            this->ptr -= n;
            insertionPoint -= n;
        }
        this->size += n;
        return insertionPoint;
    }